

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O2

void __thiscall features::Sift::extrema_detection(Sift *this)

{
  pointer pKVar1;
  pointer pOVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ImageVector *pIVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  ConstPtr samples [3];
  int local_40;
  
  pKVar1 = (this->keypoints).
           super__Vector_base<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->keypoints).
      super__Vector_base<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>.
      _M_impl.super__Vector_impl_data._M_finish != pKVar1) {
    (this->keypoints).
    super__Vector_base<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>._M_impl.
    super__Vector_impl_data._M_finish = pKVar1;
  }
  for (uVar4 = 0;
      pOVar2 = (this->octaves).
               super__Vector_base<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)(((long)(this->octaves).
                             super__Vector_base<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2) / 0x60);
      uVar4 = uVar4 + 1) {
    pIVar7 = &pOVar2[uVar4].dog;
    lVar6 = 0;
    while (lVar3 = *(long *)&(pIVar7->
                             super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                             )._M_impl.super__Vector_impl_data,
          lVar6 < ((long)*(pointer *)
                          ((long)&pOVar2[uVar4].dog.
                                  super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                                  ._M_impl + 8) - lVar3) * 0x10000000 + -0x200000000 >> 0x20) {
      std::__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<core::Image<float>,void>
                ((__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2> *)&local_78,
                 (__shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2> *)
                 (lVar3 + lVar6 * 0x10));
      lVar3 = lVar6 + 1;
      std::__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<core::Image<float>,void>
                ((__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2> *)
                 &samples[0].
                  super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 (__shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2> *)
                 (lVar3 * 0x10 +
                 *(long *)&(pIVar7->
                           super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                           )._M_impl.super__Vector_impl_data));
      std::__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<core::Image<float>,void>
                ((__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2> *)
                 &samples[1].
                  super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 (__shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2> *)
                 (*(long *)&(pIVar7->
                            super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                            )._M_impl.super__Vector_impl_data + lVar6 * 0x10 + 0x20));
      local_40 = (int)uVar4;
      extrema_detection(this,(ConstPtr *)&local_78,(this->options).min_octave + local_40,(int)lVar6)
      ;
      lVar5 = 0x28;
      do {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_78._M_pi + lVar5));
        lVar5 = lVar5 + -0x10;
        lVar6 = lVar3;
      } while (lVar5 != -8);
    }
  }
  return;
}

Assistant:

void
Sift::extrema_detection (void)
{
    /* Delete previous keypoints. */
    this->keypoints.clear();

    /* Detect keypoints in each octave... */
    for (std::size_t i = 0; i < this->octaves.size(); ++i)
    {
        Octave const& oct(this->octaves[i]);
        /* In each octave, take three subsequent DoG images and detect. */
        for (int s = 0; s < (int)oct.dog.size() - 2; ++s)
        {
            core::FloatImage::ConstPtr samples[3] =
            { oct.dog[s + 0], oct.dog[s + 1], oct.dog[s + 2] };
            this->extrema_detection(samples, static_cast<int>(i)
                + this->options.min_octave, s);
        }
    }
}